

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

int Sto_ManAddClause(Sto_Man_t *p,lit *pBeg,lit *pEnd)

{
  uint uVar1;
  uint *puVar2;
  Sto_Cls_t *pSVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  ulong __n;
  
  if (pBeg < pEnd) {
    puVar2 = (uint *)(pBeg + 1);
    for (puVar5 = puVar2; puVar5 < pEnd; puVar5 = puVar5 + 1) {
      uVar1 = *puVar5;
      for (puVar6 = puVar5; (pBeg < puVar6 && ((int)uVar1 < (int)puVar6[-1])); puVar6 = puVar6 + -1)
      {
        *puVar6 = puVar6[-1];
      }
      *puVar6 = uVar1;
    }
    do {
      if (pEnd <= puVar2) {
        iVar4 = (pEnd[-1] >> 1) + 1;
        if (iVar4 < p->nVars) {
          iVar4 = p->nVars;
        }
        p->nVars = iVar4;
        goto LAB_0041f718;
      }
      puVar5 = puVar2 + -1;
      uVar1 = *puVar2;
      puVar2 = puVar2 + 1;
    } while (1 < (uVar1 ^ *puVar5));
    iVar4 = 0;
    printf("The clause contains two literals of the same variable: %d and %d.\n");
  }
  else {
LAB_0041f718:
    __n = (long)pEnd - (long)pBeg;
    pSVar3 = (Sto_Cls_t *)
             Sto_ManMemoryFetch(p,((uint)__n + 0x20 & 0xfffffff8) + (uint)((__n & 7) != 0) * 8);
    pSVar3->pNext = (Sto_Cls_t *)0x0;
    pSVar3->pNext0 = (Sto_Cls_t *)0x0;
    pSVar3->pNext1 = (Sto_Cls_t *)0x0;
    *(undefined8 *)&pSVar3->Id = 0;
    iVar4 = p->nClauses;
    p->nClauses = iVar4 + 1;
    pSVar3->Id = iVar4;
    *(uint *)&pSVar3->field_0x1c =
         (*(uint *)&pSVar3->field_0x1c & 0xf8000007) + ((uint)__n & 0x3fffffc) * 2;
    memcpy(pSVar3 + 1,pBeg,__n);
    if (p->pHead == (Sto_Cls_t *)0x0) {
      p->pHead = pSVar3;
    }
    if (p->pTail != (Sto_Cls_t *)0x0) {
      p->pTail->pNext = pSVar3;
    }
    p->pTail = pSVar3;
    iVar4 = 1;
    if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff8) == 0) {
      if (p->pEmpty == (Sto_Cls_t *)0x0) {
        p->pEmpty = pSVar3;
      }
      else {
        puts("More than one empty clause!");
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int Sto_ManAddClause( Sto_Man_t * p, lit * pBeg, lit * pEnd )
{
    Sto_Cls_t * pClause;
    lit Lit, * i, * j;
    int nSize;

    // process the literals
    if ( pBeg < pEnd )
    {
        // insertion sort
        for ( i = pBeg + 1; i < pEnd; i++ )
        {
            Lit = *i;
            for ( j = i; j > pBeg && *(j-1) > Lit; j-- )
                *j = *(j-1);
            *j = Lit;
        }
        // make sure there is no duplicated variables
        for ( i = pBeg + 1; i < pEnd; i++ )
            if ( lit_var(*(i-1)) == lit_var(*i) )
            {
                printf( "The clause contains two literals of the same variable: %d and %d.\n", *(i-1), *i );
                return 0;
            }
        // check the largest var size
        p->nVars = STO_MAX( p->nVars, lit_var(*(pEnd-1)) + 1 );
    }

    // get memory for the clause
    nSize = sizeof(Sto_Cls_t) + sizeof(lit) * (pEnd - pBeg);
    nSize = (nSize / sizeof(char*) + ((nSize % sizeof(char*)) > 0)) * sizeof(char*); // added by Saurabh on Sep 3, 2009
    pClause = (Sto_Cls_t *)Sto_ManMemoryFetch( p, nSize );
    memset( pClause, 0, sizeof(Sto_Cls_t) );

    // assign the clause
    pClause->Id = p->nClauses++;
    pClause->nLits = pEnd - pBeg;
    memcpy( pClause->pLits, pBeg, sizeof(lit) * (pEnd - pBeg) );
//    assert( pClause->pLits[0] >= 0 );

    // add the clause to the list
    if ( p->pHead == NULL )
        p->pHead = pClause;
    if ( p->pTail == NULL )
        p->pTail = pClause;
    else
    {
        p->pTail->pNext = pClause;
        p->pTail = pClause;
    }

    // add the empty clause
    if ( pClause->nLits == 0 )
    {
        if ( p->pEmpty )
        {
            printf( "More than one empty clause!\n" );
            return 0;
        }
        p->pEmpty = pClause;
    }
    return 1;
}